

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_WriteBlifSpecial(Abc_Ntk_t *pNtk,char *FileName,char *pLutStruct,int fUseHie)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtkTemp;
  int fUseHie_local;
  char *pLutStruct_local;
  char *FileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 != 0) {
    Abc_NtkToSop(pNtk,-1,1000000000);
    pNtk_00 = Abc_NtkToNetlist(pNtk);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      fprintf(_stdout,"Writing BLIF has failed.\n");
    }
    else {
      if ((pLutStruct == (char *)0x0) || (fUseHie == 0)) {
        Io_WriteBlifInt(pNtk_00,FileName,pLutStruct,0);
      }
      else {
        Io_WriteBlifInt(pNtk_00,FileName,pLutStruct,1);
      }
      Abc_NtkDelete(pNtk_00);
    }
    return;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                ,0x56c,"void Io_WriteBlifSpecial(Abc_Ntk_t *, char *, char *, int)");
}

Assistant:

void Io_WriteBlifSpecial( Abc_Ntk_t * pNtk, char * FileName, char * pLutStruct, int fUseHie )
{
    Abc_Ntk_t * pNtkTemp;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    // derive the netlist
    pNtkTemp = Abc_NtkToNetlist(pNtk);
    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Writing BLIF has failed.\n" );
        return;
    }
    if ( pLutStruct && fUseHie )
        Io_WriteBlifInt( pNtkTemp, FileName, pLutStruct, 1 );
    else
        Io_WriteBlifInt( pNtkTemp, FileName, pLutStruct, 0 );
    Abc_NtkDelete( pNtkTemp );
}